

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void __thiscall HTTPReplySender::~HTTPReplySender(HTTPReplySender *this)

{
  long lVar1;
  void *pvVar2;
  CVmObjTable *in_RDI;
  bodyArg *in_stack_ffffffffffffffe0;
  vm_globalvar_t *in_stack_ffffffffffffffe8;
  
  in_RDI->post_load_init_table_ = (CVmHashTable *)&PTR__HTTPReplySender_0042bdd8;
  if ((int)in_RDI->max_bytes_between_gc_ != 0) {
    lib_free_str((char *)0x25bcb5);
    lib_free_str((char *)0x25bcc5);
    if ((*(long *)&in_RDI->max_allocs_between_gc_ != 0) &&
       (in_stack_ffffffffffffffe8 = *(vm_globalvar_t **)&in_RDI->max_allocs_between_gc_,
       in_stack_ffffffffffffffe8 != (vm_globalvar_t *)0x0)) {
      vm_httpreq_cookie::~vm_httpreq_cookie((vm_httpreq_cookie *)in_stack_ffffffffffffffe0);
      operator_delete(in_stack_ffffffffffffffe8,0x18);
    }
  }
  if ((in_RDI->image_ptr_last_cnt_ != 0) &&
     (in_stack_ffffffffffffffe0 = (bodyArg *)in_RDI->image_ptr_last_cnt_,
     in_stack_ffffffffffffffe0 != (bodyArg *)0x0)) {
    http_header::~http_header((http_header *)in_stack_ffffffffffffffe0);
    operator_delete(in_stack_ffffffffffffffe0,0x18);
  }
  if (in_RDI->pages_ != (CVmObjPageEntry **)0x0) {
    CVmRefCntObj::release_ref((CVmRefCntObj *)in_stack_ffffffffffffffe0);
  }
  if (*(long *)&in_RDI->first_free_ != 0) {
    CVmRefCntObj::release_ref((CVmRefCntObj *)in_stack_ffffffffffffffe0);
  }
  if (in_RDI->pages_used_ != 0) {
    CVmObjTable::delete_global_var(in_RDI,in_stack_ffffffffffffffe8);
  }
  lVar1._0_4_ = in_RDI->gc_queue_head_;
  lVar1._4_4_ = in_RDI->finalize_queue_head_;
  if ((lVar1 != 0) && (pvVar2 = *(void **)&in_RDI->gc_queue_head_, pvVar2 != (void *)0x0)) {
    bodyArg::~bodyArg(in_stack_ffffffffffffffe0);
    operator_delete(pvVar2,0x58);
  }
  CVmRefCntObj::~CVmRefCntObj((CVmRefCntObj *)in_RDI);
  return;
}

Assistant:

~HTTPReplySender()
    {
        /* if we're in async mode, delete our private parameter data */
        if (async)
        {
            lib_free_str((char *)status);
            lib_free_str((char *)cont_type);
            if (cookies != 0)
                delete cookies;
        }

        /* delete the headers (we always copy these) */
        if (headers != 0)
            delete headers;

        /* release the net event queue */
        if (queue != 0)
            queue->release_ref();

        /* done with the request object and VM global */
        if (req != 0)
            req->release_ref();
        if (reqvar != 0)
        {
            VMGLOB_PTR(vmg);
            G_obj_table->delete_global_var(reqvar);
        }

        /* done with the body object */
        if (body != 0)
            delete body;
    }